

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_rebalance(MDB_cursor *mc)

{
  MDB_page **ret;
  indx_t iVar1;
  MDB_page *pMVar2;
  MDB_txn *pMVar3;
  MDB_page *pMVar4;
  MDB_page *pMVar5;
  MDB_xcursor *pMVar6;
  MDB_cursor **ppMVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  MDB_db *pMVar12;
  MDB_xcursor *pMVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  MDB_cursor *pMVar18;
  indx_t iVar19;
  MDB_xcursor *pMVar20;
  indx_t *piVar21;
  uint line;
  int line_00;
  MDB_xcursor *pMVar22;
  ulong uVar23;
  uint *puVar24;
  indx_t iVar25;
  MDB_val local_4f8;
  MDB_page **local_4e8;
  ulong local_4e0;
  MDB_val local_4d8;
  MDB_cursor mn;
  MDB_cursor dummy_2;
  MDB_cursor dummy;
  
  uVar8 = mc->mc_top;
  pMVar2 = mc->mc_pg[uVar8];
  uVar14 = (pMVar2->mp_flags & 1) + 1;
  uVar23 = 1;
  if ((pMVar2->mp_flags & 1) == 0) {
    uVar23 = 0xfa;
  }
  pMVar3 = mc->mc_txn;
  line = pMVar3->mt_env->me_psize - 0x10;
  uVar15 = (uint)(pMVar2->mp_pb).pb.pb_lower;
  if ((uVar23 <= ((ulong)(line - ((pMVar2->mp_pb).pb.pb_upper - uVar15 & 0xffff)) * 1000) /
                 (ulong)line) && (uVar14 <= uVar15 - 0x10 >> 1)) {
    return 0;
  }
  ret = mc->mc_pg;
  if (mc->mc_snum < 2) {
    pMVar2 = *ret;
    if ((pMVar2->mp_flags & 0x40) != 0) {
      return 0;
    }
    uVar14 = (pMVar2->mp_pb).pb.pb_lower - 0x10;
    if (uVar14 < 2) {
      pMVar12 = mc->mc_db;
      pMVar12->md_root = 0xffffffffffffffff;
      pMVar12->md_depth = 0;
      pMVar12->md_leaf_pages = 0;
      iVar9 = mdb_midl_append(&pMVar3->mt_free_pgs,(pMVar2->mp_p).p_pgno);
      if (iVar9 != 0) {
        return iVar9;
      }
      mc->mc_snum = 0;
      mc->mc_top = 0;
      *(byte *)&mc->mc_flags = (byte)mc->mc_flags & 0xfe;
      pMVar22 = (MDB_xcursor *)(mc->mc_txn->mt_cursors + mc->mc_dbi);
      while (pMVar22 = (MDB_xcursor *)(pMVar22->mx_cursor).mc_next, pMVar22 != (MDB_xcursor *)0x0) {
        pMVar13 = pMVar22;
        if ((mc->mc_flags & 4) != 0) {
          pMVar13 = *(MDB_xcursor **)((long)&pMVar22->mx_cursor + 0x10);
        }
        uVar14 = (pMVar13->mx_cursor).mc_flags;
        if ((((uVar14 & 1) != 0) && (mc->mc_snum <= (pMVar13->mx_cursor).mc_snum)) &&
           ((pMVar13->mx_cursor).mc_pg[0] == pMVar2)) {
          (pMVar13->mx_cursor).mc_snum = 0;
          (pMVar13->mx_cursor).mc_top = 0;
          (pMVar13->mx_cursor).mc_flags = uVar14 & 0xfffffffe;
        }
      }
      return 0;
    }
    if ((pMVar2->mp_flags & 1) == 0) {
      return 0;
    }
    if ((uVar14 & 0xfffffffe) != 2) {
      return 0;
    }
    iVar9 = mdb_midl_append(&pMVar3->mt_free_pgs,(pMVar2->mp_p).p_pgno);
    if (iVar9 != 0) {
      return iVar9;
    }
    uVar23 = (ulong)CONCAT24(*(undefined2 *)
                              ((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 0xc)),
                             *(undefined4 *)
                              ((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 0x10)));
    mc->mc_db->md_root = uVar23;
    iVar9 = mdb_page_get(mc,uVar23,ret,(int *)0x0);
    if (iVar9 != 0) {
      return iVar9;
    }
    pMVar12 = mc->mc_db;
    pMVar12->md_depth = pMVar12->md_depth - 1;
    pMVar12->md_branch_pages = pMVar12->md_branch_pages - 1;
    mc->mc_ki[0] = mc->mc_ki[1];
    for (lVar17 = 0xa6; lVar17 - 0xa5U < (ulong)pMVar12->md_depth; lVar17 = lVar17 + 1) {
      *(undefined8 *)((long)mc + lVar17 * 8 + -0x4e0) =
           *(undefined8 *)((long)mc + lVar17 * 8 + -0x4d8);
      *(undefined2 *)((long)mc->mc_pg + lVar17 * 2 + -0x4a) =
           *(undefined2 *)((long)mc->mc_pg + lVar17 * 2 + -0x48);
    }
    pMVar18 = (MDB_cursor *)(mc->mc_txn->mt_cursors + mc->mc_dbi);
    while (pMVar18 = pMVar18->mc_next, pMVar18 != (MDB_cursor *)0x0) {
      pMVar22 = (MDB_xcursor *)pMVar18;
      if ((mc->mc_flags & 4) != 0) {
        pMVar22 = pMVar18->mc_xcursor;
      }
      if (((pMVar22 != (MDB_xcursor *)mc) &&
          ((*(byte *)((long)&pMVar22->mx_cursor + 0x44) & 1) != 0)) &&
         (*(MDB_page **)((long)&pMVar22->mx_cursor + 0x48) == pMVar2)) {
        for (uVar23 = 0; uVar23 < pMVar12->md_depth; uVar23 = uVar23 + 1) {
          *(MDB_cursor **)((long)&pMVar22->mx_cursor + (uVar23 + 9) * 8) =
               *(MDB_cursor **)((long)&pMVar22->mx_cursor + (uVar23 + 10) * 8);
          *(undefined2 *)((long)&pMVar22->mx_cursor + uVar23 * 2 + 0x148) =
               *(undefined2 *)((long)&pMVar22->mx_cursor + uVar23 * 2 + 0x14a);
          pMVar12 = mc->mc_db;
        }
        *(uint *)((long)&pMVar22->mx_cursor + 0x40) =
             CONCAT22((short)((ulong)*(undefined8 *)((long)&pMVar22->mx_cursor + 0x40) >> 0x10) + -1
                      ,(short)*(undefined8 *)((long)&pMVar22->mx_cursor + 0x40) + -1);
      }
    }
    return 0;
  }
  local_4e0 = CONCAT44(local_4e0._4_4_,uVar14);
  uVar14 = uVar8 - 1;
  pMVar2 = ret[uVar14];
  local_4e8 = ret;
  if (((pMVar2->mp_pb).pb.pb_lower & 0xfffc) == 0x10) {
    mdb_assert_fail(pMVar3->mt_env,"NUMKEYS(mc->mc_pg[ptop]) > 1","mdb_rebalance",(char *)0x22f5,
                    line);
  }
  pMVar18 = &mn;
  mdb_cursor_copy(mc,pMVar18);
  mn.mc_xcursor = (MDB_xcursor *)0x0;
  iVar25 = mc->mc_ki[uVar8];
  iVar1 = mc->mc_ki[uVar14];
  if (iVar1 == 0) {
    uVar8 = mn.mc_ki[uVar14] + 1;
    mn.mc_ki[uVar14] = uVar8;
    iVar9 = mdb_page_get(mc,(ulong)CONCAT24(*(undefined2 *)
                                             ((long)pMVar2->mp_ptrs +
                                             ((ulong)pMVar2->mp_ptrs[uVar8] - 0xc)),
                                            *(undefined4 *)
                                             ((long)pMVar2->mp_ptrs +
                                             ((ulong)pMVar2->mp_ptrs[uVar8] - 0x10))),
                         mn.mc_pg + mn.mc_top,(int *)0x0);
    if (iVar9 != 0) {
      return iVar9;
    }
    uVar16 = (ulong)mn.mc_top;
    mn.mc_ki[uVar16] = 0;
    uVar11 = (ulong)mc->mc_top;
    iVar19 = (indx_t)((mc->mc_pg[uVar11]->mp_pb).pb.pb_lower + 0x1fff0 >> 1);
  }
  else {
    uVar8 = mn.mc_ki[uVar14] - 1;
    mn.mc_ki[uVar14] = uVar8;
    iVar9 = mdb_page_get(mc,(ulong)CONCAT24(*(undefined2 *)
                                             ((long)pMVar2->mp_ptrs +
                                             ((ulong)pMVar2->mp_ptrs[uVar8] - 0xc)),
                                            *(undefined4 *)
                                             ((long)pMVar2->mp_ptrs +
                                             ((ulong)pMVar2->mp_ptrs[uVar8] - 0x10))),
                         mn.mc_pg + mn.mc_top,(int *)0x0);
    if (iVar9 != 0) {
      return iVar9;
    }
    uVar16 = (ulong)mn.mc_top;
    mn.mc_ki[uVar16] = (short)((mn.mc_pg[uVar16]->mp_pb).pb.pb_lower + 0x1fff0 >> 1) - 1;
    uVar11 = (ulong)mc->mc_top;
    iVar19 = 0;
  }
  mc->mc_ki[uVar11] = iVar19;
  uVar14 = mc->mc_txn->mt_env->me_psize - 0x10;
  uVar8 = (mn.mc_pg[uVar16]->mp_pb).pb.pb_lower;
  if ((((ulong)(uVar14 - ((uint)(mn.mc_pg[uVar16]->mp_pb).pb.pb_upper - (uint)uVar8 & 0xffff)) *
       1000) / (ulong)uVar14 < uVar23) || (uVar8 - 0x10 >> 1 <= (uint)local_4e0)) {
    if (iVar1 == 0) {
      iVar9 = mdb_page_merge(&mn,mc);
    }
    else {
      uVar23 = (ulong)(uint)((int)uVar16 * 2);
      iVar25 = iVar25 + (short)(uVar8 + 0x1fff0 >> 1);
      *(short *)((long)mn.mc_ki + uVar23) =
           *(short *)((long)mc->mc_ki + uVar23) + *(short *)((long)mn.mc_ki + uVar23) + 1;
      ppMVar7 = (mn.mc_txn)->mt_cursors;
      uVar23 = (ulong)mn.mc_dbi;
      if ((mn.mc_flags & 4) != 0) {
        pMVar18 = &dummy_2;
        dummy_2.mc_flags = 1;
        dummy_2.mc_xcursor = (MDB_xcursor *)&mn;
      }
      pMVar18->mc_next = ppMVar7[uVar23];
      ppMVar7[uVar23] = pMVar18;
      iVar9 = mdb_page_merge(mc,&mn);
      ppMVar7[uVar23] = pMVar18->mc_next;
      mdb_cursor_copy(&mn,mc);
    }
    *(byte *)&mc->mc_flags = (byte)mc->mc_flags & 0xfd;
    goto LAB_0010c61e;
  }
  iVar9 = mdb_page_touch(&mn);
  if ((iVar9 == 0) && (iVar9 = mdb_page_touch(mc), iVar9 == 0)) {
    uVar23 = (ulong)mn.mc_top;
    pMVar2 = mn.mc_pg[uVar23];
    if ((pMVar2->mp_flags & 0x20) == 0) {
      puVar24 = (uint *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[mn.mc_ki[uVar23]] - 0x10));
      if (((ulong)puVar24 & 1) != 0) {
        mdb_assert_fail((mn.mc_txn)->mt_env,"!((size_t)srcnode & 1)","mdb_node_move",(char *)0x2104,
                        line);
      }
      uVar15 = *puVar24;
      uVar11 = (ulong)(ushort)puVar24[1];
      if (((pMVar2->mp_flags & 1) == 0) || (mn.mc_ki[uVar23] != 0)) {
        uVar23 = (ulong)*(ushort *)((long)puVar24 + 6);
        local_4f8.mv_data = puVar24 + 2;
        local_4f8.mv_size = uVar23;
      }
      else {
        local_4e0 = uVar11;
        iVar9 = mdb_page_search_lowest(&mn);
        if (iVar9 != 0) goto LAB_0010c613;
        pMVar2 = mn.mc_pg[mn.mc_top];
        if ((pMVar2->mp_flags & 0x20) == 0) {
          local_4f8.mv_data = (void *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 8));
          local_4f8.mv_size =
               (size_t)*(ushort *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 10));
        }
        else {
          local_4f8.mv_size = (size_t)(mn.mc_db)->md_pad;
          local_4f8.mv_data = pMVar2->mp_ptrs;
        }
        mn.mc_top = mn.mc_snum - 1;
        uVar23 = (ulong)*(ushort *)((long)puVar24 + 6);
        uVar11 = local_4e0;
      }
      uVar14 = (uint)uVar11;
      pMVar22 = (MDB_xcursor *)(uVar11 << 0x20 | (ulong)uVar15);
      local_4d8.mv_data = (void *)((long)puVar24 + uVar23 + 8);
      local_4d8.mv_size = (ulong)*puVar24;
    }
    else {
      local_4f8.mv_size = (size_t)(mn.mc_db)->md_pad;
      local_4f8.mv_data = (void *)((long)pMVar2->mp_ptrs + mn.mc_ki[uVar23] * local_4f8.mv_size);
      local_4d8.mv_size = 0;
      local_4d8.mv_data = (void *)0x0;
      uVar14 = 0;
      pMVar22 = (MDB_xcursor *)0x0;
    }
    dummy_2.mc_xcursor = (MDB_xcursor *)0x0;
    uVar23 = (ulong)mc->mc_top;
    if (((mc->mc_pg[uVar23]->mp_flags & 1) == 0) || (mc->mc_ki[uVar23] != 0)) {
LAB_0010c5ef:
      iVar9 = mdb_node_add(mc,mc->mc_ki[uVar23],&local_4f8,&local_4d8,(pgno_t)pMVar22,uVar14);
      if (iVar9 == 0) {
        mdb_node_del(&mn,(int)local_4f8.mv_size);
        pMVar2 = mn.mc_pg[mn.mc_top];
        if (iVar1 == 0) {
          pMVar13 = (MDB_xcursor *)((mn.mc_txn)->mt_cursors + mn.mc_dbi);
          while( true ) {
            line_00 = (int)pMVar22;
            pMVar13 = (MDB_xcursor *)(pMVar13->mx_cursor).mc_next;
            if (pMVar13 == (MDB_xcursor *)0x0) break;
            pMVar20 = pMVar13;
            if ((mn.mc_flags & 4) != 0) {
              pMVar20 = (pMVar13->mx_cursor).mc_xcursor;
            }
            if ((((pMVar20 != (MDB_xcursor *)&mn) && (((pMVar20->mx_cursor).mc_flags & 1) != 0)) &&
                (uVar23 = (ulong)mn.mc_top, mn.mc_top <= (pMVar20->mx_cursor).mc_top)) &&
               ((pMVar20->mx_cursor).mc_pg[uVar23] == pMVar2)) {
              uVar8 = (pMVar20->mx_cursor).mc_ki[uVar23];
              if (uVar8 == 0) {
                uVar8 = mc->mc_top;
                (pMVar20->mx_cursor).mc_pg[uVar23] = mc->mc_pg[uVar8];
                (pMVar20->mx_cursor).mc_ki[uVar23] = mc->mc_ki[uVar8];
                piVar21 = (indx_t *)
                          ((long)(pMVar20->mx_cursor).mc_ki + ((ulong)((uint)mn.mc_top * 2) - 2));
                uVar8 = *(ushort *)
                         ((long)(pMVar20->mx_cursor).mc_ki + ((ulong)((uint)mn.mc_top * 2) - 2));
              }
              else {
                piVar21 = (pMVar20->mx_cursor).mc_ki + uVar23;
              }
              pMVar22 = (MDB_xcursor *)(ulong)(uVar8 - 1);
              *piVar21 = (indx_t)(uVar8 - 1);
              pMVar6 = (pMVar20->mx_cursor).mc_xcursor;
              if (((pMVar6 != (MDB_xcursor *)0x0) && (((pMVar6->mx_cursor).mc_flags & 1) != 0)) &&
                 ((pMVar2->mp_flags & 2) != 0)) {
                pMVar22 = (MDB_xcursor *)(pMVar20->mx_cursor).mc_pg[mn.mc_top];
                uVar23 = (ulong)*(ushort *)
                                 ((long)(pMVar22->mx_cursor).mc_pg +
                                 (ulong)(pMVar20->mx_cursor).mc_ki[mn.mc_top] * 2 + -0x38);
                if ((*(ushort *)((long)(pMVar22->mx_cursor).mc_pg + (uVar23 - 0x44)) & 6) == 4) {
                  pMVar22 = (MDB_xcursor *)((long)(pMVar22->mx_cursor).mc_pg + (uVar23 - 0x48));
                  (pMVar6->mx_cursor).mc_pg[0] =
                       (MDB_page *)
                       ((long)(pMVar22->mx_cursor).mc_pg +
                       ((ulong)*(ushort *)((long)&(pMVar22->mx_cursor).mc_next + 6) - 0x40));
                }
              }
            }
          }
        }
        else {
          pMVar4 = local_4e8[mn.mc_top];
          pMVar13 = (MDB_xcursor *)((mn.mc_txn)->mt_cursors + mn.mc_dbi);
          while( true ) {
            line_00 = (int)pMVar22;
            pMVar13 = (MDB_xcursor *)(pMVar13->mx_cursor).mc_next;
            if (pMVar13 == (MDB_xcursor *)0x0) break;
            pMVar20 = pMVar13;
            if ((mn.mc_flags & 4) != 0) {
              pMVar20 = (pMVar13->mx_cursor).mc_xcursor;
            }
            if ((((pMVar20->mx_cursor).mc_flags & 1) != 0) &&
               (pMVar22 = (MDB_xcursor *)(ulong)mn.mc_top, mn.mc_top <= (pMVar20->mx_cursor).mc_top)
               ) {
              if ((pMVar20 != (MDB_xcursor *)mc) &&
                 (((pMVar20->mx_cursor).mc_pg[(long)pMVar22] == pMVar4 &&
                  (uVar8 = *(ushort *)
                            ((long)(pMVar20->mx_cursor).mc_ki +
                            (ulong)((uint)mn.mc_top + (uint)mn.mc_top)),
                  *(ushort *)((long)mc->mc_ki + (ulong)((uint)mn.mc_top + (uint)mn.mc_top)) <= uVar8
                  )))) {
                (pMVar20->mx_cursor).mc_ki[(long)pMVar22] = uVar8 + 1;
              }
              if (((pMVar20 != (MDB_xcursor *)&mn) &&
                  (uVar23 = (ulong)mn.mc_top, (pMVar20->mx_cursor).mc_pg[uVar23] == pMVar2)) &&
                 (*(short *)((long)(pMVar20->mx_cursor).mc_ki +
                            (ulong)((uint)mn.mc_top + (uint)mn.mc_top)) ==
                  *(short *)((long)mn.mc_ki + (ulong)((uint)mn.mc_top + (uint)mn.mc_top)))) {
                uVar8 = mc->mc_top;
                (pMVar20->mx_cursor).mc_pg[uVar23] = mc->mc_pg[uVar8];
                (pMVar20->mx_cursor).mc_ki[uVar23] = mc->mc_ki[uVar8];
                piVar21 = (pMVar20->mx_cursor).mc_ki + ((ulong)mn.mc_top - 1);
                *piVar21 = *piVar21 + 1;
              }
              pMVar22 = (pMVar20->mx_cursor).mc_xcursor;
              if (((pMVar22 != (MDB_xcursor *)0x0) && (((pMVar22->mx_cursor).mc_flags & 1) != 0)) &&
                 ((pMVar2->mp_flags & 2) != 0)) {
                pMVar5 = (pMVar20->mx_cursor).mc_pg[mn.mc_top];
                uVar23 = (ulong)pMVar5->mp_ptrs[(pMVar20->mx_cursor).mc_ki[mn.mc_top]];
                if ((*(ushort *)((long)pMVar5->mp_ptrs + (uVar23 - 0xc)) & 6) == 4) {
                  (pMVar22->mx_cursor).mc_pg[0] =
                       (MDB_page *)
                       ((long)pMVar5->mp_ptrs +
                       *(ushort *)((long)pMVar5->mp_ptrs + (uVar23 - 10)) + uVar23 + -8);
                }
              }
            }
          }
        }
        uVar23 = (ulong)mn.mc_top;
        uVar11 = (ulong)mn.mc_top;
        if (mn.mc_ki[uVar23] == 0) {
          if (mn.mc_ki[uVar23 - 1] != 0) {
            pMVar2 = mn.mc_pg[uVar23];
            if ((pMVar2->mp_flags & 0x20) == 0) {
              local_4f8.mv_data = (void *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 8));
              local_4f8.mv_size =
                   (size_t)*(ushort *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 10));
            }
            else {
              local_4f8.mv_data = pMVar2->mp_ptrs;
            }
            pMVar18 = &dummy_2;
            mdb_cursor_copy(&mn,pMVar18);
            dummy_2.mc_snum = dummy_2.mc_snum - 1;
            dummy_2.mc_top = dummy_2.mc_top - 1;
            ppMVar7 = (dummy_2.mc_txn)->mt_cursors;
            uVar23 = (ulong)dummy_2.mc_dbi;
            if ((dummy_2.mc_flags & 4) != 0) {
              pMVar18 = &dummy;
              dummy.mc_flags = 1;
              dummy.mc_xcursor = (MDB_xcursor *)&dummy_2;
            }
            pMVar18->mc_next = ppMVar7[uVar23];
            ppMVar7[uVar23] = pMVar18;
            iVar9 = mdb_update_key(&dummy_2,&local_4f8);
            ppMVar7[uVar23] = pMVar18->mc_next;
            if (iVar9 != 0) goto LAB_0010c613;
            uVar11 = (ulong)mn.mc_top;
          }
          if ((mn.mc_pg[uVar11]->mp_flags & 1) != 0) {
            dummy.mc_next = (MDB_cursor *)0x0;
            iVar19 = mn.mc_ki[uVar11];
            mn.mc_ki[uVar11] = 0;
            iVar9 = mdb_update_key(&mn,(MDB_val *)&dummy);
            uVar11 = (ulong)mn.mc_top;
            mn.mc_ki[uVar11] = iVar19;
            if (iVar9 != 0) {
              mdb_assert_fail((mn.mc_txn)->mt_env,"rc == MDB_SUCCESS","mdb_node_move",(char *)0x21a9
                              ,line_00);
            }
          }
        }
        uVar23 = (ulong)mc->mc_top;
        iVar9 = 0;
        if (mc->mc_ki[uVar23] == 0) {
          if (mc->mc_ki[uVar23 - 1] != 0) {
            pMVar2 = local_4e8[uVar23];
            if ((mn.mc_pg[uVar11]->mp_flags & 0x20) == 0) {
              local_4f8.mv_data = (void *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 8));
              local_4f8.mv_size =
                   (size_t)*(ushort *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 10));
            }
            else {
              local_4f8.mv_data = pMVar2->mp_ptrs;
            }
            pMVar18 = &dummy_2;
            mdb_cursor_copy(mc,pMVar18);
            dummy_2.mc_snum = dummy_2.mc_snum - 1;
            dummy_2.mc_top = dummy_2.mc_top - 1;
            ppMVar7 = (dummy_2.mc_txn)->mt_cursors;
            uVar23 = (ulong)dummy_2.mc_dbi;
            if ((dummy_2.mc_flags & 4) != 0) {
              pMVar18 = &dummy;
              dummy.mc_flags = 1;
              dummy.mc_xcursor = (MDB_xcursor *)&dummy_2;
            }
            pMVar18->mc_next = ppMVar7[uVar23];
            ppMVar7[uVar23] = pMVar18;
            iVar9 = mdb_update_key(&dummy_2,&local_4f8);
            ppMVar7[uVar23] = pMVar18->mc_next;
            if (iVar9 != 0) goto LAB_0010c613;
            uVar23 = (ulong)mc->mc_top;
          }
          iVar9 = 0;
          if ((local_4e8[uVar23]->mp_flags & 1) != 0) {
            iVar19 = mc->mc_ki[uVar23];
            dummy.mc_next = (MDB_cursor *)0x0;
            mc->mc_ki[uVar23] = 0;
            iVar10 = mdb_update_key(mc,(MDB_val *)&dummy);
            mc->mc_ki[mc->mc_top] = iVar19;
            iVar9 = 0;
            if (iVar10 != 0) {
              mdb_assert_fail(mc->mc_txn->mt_env,"rc == MDB_SUCCESS","mdb_node_move",(char *)0x21c8,
                              line_00);
            }
          }
        }
      }
    }
    else {
      uVar8 = mc->mc_snum;
      mdb_cursor_copy(mc,&dummy_2);
      iVar9 = mdb_page_search_lowest(&dummy_2);
      if (iVar9 == 0) {
        pMVar2 = dummy_2.mc_pg[dummy_2.mc_top];
        if ((pMVar2->mp_flags & 0x20) == 0) {
          dummy.mc_backup = (MDB_cursor *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 8));
          dummy.mc_next =
               (MDB_cursor *)
               (ulong)*(ushort *)((long)pMVar2->mp_ptrs + ((ulong)pMVar2->mp_ptrs[0] - 10));
        }
        else {
          dummy.mc_next = (MDB_cursor *)(ulong)(dummy_2.mc_db)->md_pad;
          dummy.mc_backup = (MDB_cursor *)pMVar2->mp_ptrs;
        }
        uVar15 = uVar8 - 1;
        dummy_2.mc_top = (unsigned_short)uVar15;
        dummy_2.mc_ki[uVar15] = 0;
        dummy_2.mc_snum = uVar8;
        iVar9 = mdb_update_key(&dummy_2,(MDB_val *)&dummy);
        if (iVar9 == 0) {
          uVar23 = (ulong)mc->mc_top;
          goto LAB_0010c5ef;
        }
      }
    }
  }
LAB_0010c613:
  iVar25 = (iVar25 + 1) - (ushort)(iVar1 == 0);
LAB_0010c61e:
  mc->mc_ki[mc->mc_top] = iVar25;
  return iVar9;
}

Assistant:

static int
mdb_rebalance(MDB_cursor *mc)
{
	MDB_node	*node;
	int rc, fromleft;
	unsigned int ptop, minkeys, thresh;
	MDB_cursor	mn;
	indx_t oldki;

	if (IS_BRANCH(mc->mc_pg[mc->mc_top])) {
		minkeys = 2;
		thresh = 1;
	} else {
		minkeys = 1;
		thresh = FILL_THRESHOLD;
	}
	DPRINTF(("rebalancing %s page %"Y"u (has %u keys, %.1f%% full)",
	    IS_LEAF(mc->mc_pg[mc->mc_top]) ? "leaf" : "branch",
	    mdb_dbg_pgno(mc->mc_pg[mc->mc_top]), NUMKEYS(mc->mc_pg[mc->mc_top]),
		(float)PAGEFILL(mc->mc_txn->mt_env, mc->mc_pg[mc->mc_top]) / 10));

	if (PAGEFILL(mc->mc_txn->mt_env, mc->mc_pg[mc->mc_top]) >= thresh &&
		NUMKEYS(mc->mc_pg[mc->mc_top]) >= minkeys) {
		DPRINTF(("no need to rebalance page %"Y"u, above fill threshold",
		    mdb_dbg_pgno(mc->mc_pg[mc->mc_top])));
		return MDB_SUCCESS;
	}

	if (mc->mc_snum < 2) {
		MDB_page *mp = mc->mc_pg[0];
		if (IS_SUBP(mp)) {
			DPUTS("Can't rebalance a subpage, ignoring");
			return MDB_SUCCESS;
		}
		if (NUMKEYS(mp) == 0) {
			DPUTS("tree is completely empty");
			mc->mc_db->md_root = P_INVALID;
			mc->mc_db->md_depth = 0;
			mc->mc_db->md_leaf_pages = 0;
			rc = mdb_midl_append(&mc->mc_txn->mt_free_pgs, mp->mp_pgno);
			if (rc)
				return rc;
			/* Adjust cursors pointing to mp */
			mc->mc_snum = 0;
			mc->mc_top = 0;
			mc->mc_flags &= ~C_INITIALIZED;
			{
				MDB_cursor *m2, *m3;
				MDB_dbi dbi = mc->mc_dbi;

				for (m2 = mc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
					if (mc->mc_flags & C_SUB)
						m3 = &m2->mc_xcursor->mx_cursor;
					else
						m3 = m2;
					if (!(m3->mc_flags & C_INITIALIZED) || (m3->mc_snum < mc->mc_snum))
						continue;
					if (m3->mc_pg[0] == mp) {
						m3->mc_snum = 0;
						m3->mc_top = 0;
						m3->mc_flags &= ~C_INITIALIZED;
					}
				}
			}
		} else if (IS_BRANCH(mp) && NUMKEYS(mp) == 1) {
			int i;
			DPUTS("collapsing root page!");
			rc = mdb_midl_append(&mc->mc_txn->mt_free_pgs, mp->mp_pgno);
			if (rc)
				return rc;
			mc->mc_db->md_root = NODEPGNO(NODEPTR(mp, 0));
			rc = mdb_page_get(mc, mc->mc_db->md_root, &mc->mc_pg[0], NULL);
			if (rc)
				return rc;
			mc->mc_db->md_depth--;
			mc->mc_db->md_branch_pages--;
			mc->mc_ki[0] = mc->mc_ki[1];
			for (i = 1; i<mc->mc_db->md_depth; i++) {
				mc->mc_pg[i] = mc->mc_pg[i+1];
				mc->mc_ki[i] = mc->mc_ki[i+1];
			}
			{
				/* Adjust other cursors pointing to mp */
				MDB_cursor *m2, *m3;
				MDB_dbi dbi = mc->mc_dbi;

				for (m2 = mc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
					if (mc->mc_flags & C_SUB)
						m3 = &m2->mc_xcursor->mx_cursor;
					else
						m3 = m2;
					if (m3 == mc) continue;
					if (!(m3->mc_flags & C_INITIALIZED))
						continue;
					if (m3->mc_pg[0] == mp) {
						for (i=0; i<mc->mc_db->md_depth; i++) {
							m3->mc_pg[i] = m3->mc_pg[i+1];
							m3->mc_ki[i] = m3->mc_ki[i+1];
						}
						m3->mc_snum--;
						m3->mc_top--;
					}
				}
			}
		} else
			DPUTS("root page doesn't need rebalancing");
		return MDB_SUCCESS;
	}

	/* The parent (branch page) must have at least 2 pointers,
	 * otherwise the tree is invalid.
	 */
	ptop = mc->mc_top-1;
	mdb_cassert(mc, NUMKEYS(mc->mc_pg[ptop]) > 1);

	/* Leaf page fill factor is below the threshold.
	 * Try to move keys from left or right neighbor, or
	 * merge with a neighbor page.
	 */

	/* Find neighbors.
	 */
	mdb_cursor_copy(mc, &mn);
	mn.mc_xcursor = NULL;

	oldki = mc->mc_ki[mc->mc_top];
	if (mc->mc_ki[ptop] == 0) {
		/* We're the leftmost leaf in our parent.
		 */
		DPUTS("reading right neighbor");
		mn.mc_ki[ptop]++;
		node = NODEPTR(mc->mc_pg[ptop], mn.mc_ki[ptop]);
		rc = mdb_page_get(mc, NODEPGNO(node), &mn.mc_pg[mn.mc_top], NULL);
		if (rc)
			return rc;
		mn.mc_ki[mn.mc_top] = 0;
		mc->mc_ki[mc->mc_top] = NUMKEYS(mc->mc_pg[mc->mc_top]);
		fromleft = 0;
	} else {
		/* There is at least one neighbor to the left.
		 */
		DPUTS("reading left neighbor");
		mn.mc_ki[ptop]--;
		node = NODEPTR(mc->mc_pg[ptop], mn.mc_ki[ptop]);
		rc = mdb_page_get(mc, NODEPGNO(node), &mn.mc_pg[mn.mc_top], NULL);
		if (rc)
			return rc;
		mn.mc_ki[mn.mc_top] = NUMKEYS(mn.mc_pg[mn.mc_top]) - 1;
		mc->mc_ki[mc->mc_top] = 0;
		fromleft = 1;
	}

	DPRINTF(("found neighbor page %"Y"u (%u keys, %.1f%% full)",
	    mn.mc_pg[mn.mc_top]->mp_pgno, NUMKEYS(mn.mc_pg[mn.mc_top]),
		(float)PAGEFILL(mc->mc_txn->mt_env, mn.mc_pg[mn.mc_top]) / 10));

	/* If the neighbor page is above threshold and has enough keys,
	 * move one key from it. Otherwise we should try to merge them.
	 * (A branch page must never have less than 2 keys.)
	 */
	if (PAGEFILL(mc->mc_txn->mt_env, mn.mc_pg[mn.mc_top]) >= thresh && NUMKEYS(mn.mc_pg[mn.mc_top]) > minkeys) {
		rc = mdb_node_move(&mn, mc, fromleft);
		if (fromleft) {
			/* if we inserted on left, bump position up */
			oldki++;
		}
	} else {
		if (!fromleft) {
			rc = mdb_page_merge(&mn, mc);
		} else {
			oldki += NUMKEYS(mn.mc_pg[mn.mc_top]);
			mn.mc_ki[mn.mc_top] += mc->mc_ki[mn.mc_top] + 1;
			/* We want mdb_rebalance to find mn when doing fixups */
			WITH_CURSOR_TRACKING(mn,
				rc = mdb_page_merge(mc, &mn));
			mdb_cursor_copy(&mn, mc);
		}
		mc->mc_flags &= ~C_EOF;
	}
	mc->mc_ki[mc->mc_top] = oldki;
	return rc;
}